

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UBool writeStage3Roundtrip(void *context,uint32_t value,UChar32 *codePoints)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint *puVar6;
  undefined1 *puVar7;
  int local_50;
  int32_t st3;
  int32_t i;
  UChar32 c;
  uint8_t *p;
  uint8_t *bytes;
  uint32_t *stage2;
  uint16_t *table;
  UConverterMBCSTable *mbcsTable;
  UChar32 *codePoints_local;
  uint32_t value_local;
  void *context_local;
  
  lVar3 = *(long *)((long)context + 0x28);
  lVar4 = *(long *)((long)context + 0xb8);
  codePoints_local._4_4_ = value;
  if (*(char *)((long)context + 0xcc) == '\b') {
    if (0xffff < value) {
      if (value < 0x8f0000) {
        codePoints_local._4_4_ = value & 0x7fff;
      }
      else {
        codePoints_local._4_4_ = value & 0xff7f;
      }
    }
  }
  else if ((*(char *)((long)context + 0xcc) == '\t') && (0xffffff < value)) {
    if (value < 0x8f000000) {
      codePoints_local._4_4_ = value & 0x7fffff;
    }
    else {
      codePoints_local._4_4_ = value & 0xff7fff;
    }
  }
  local_50 = 0;
  do {
    if (0x1f < local_50) {
      return '\x01';
    }
    uVar2 = codePoints[local_50];
    if (-1 < (int)uVar2) {
      puVar6 = (uint *)(lVar3 + (ulong)*(ushort *)(lVar3 + (long)((int)uVar2 >> 10) * 2) * 4 +
                       (ulong)(uVar2 >> 2 & 0xfc));
      uVar5 = (uint)(ushort)*puVar6 << 4 | uVar2 & 0xf;
      cVar1 = *(char *)((long)context + 0xcc);
      if (cVar1 == '\x02') {
LAB_00393c2a:
        puVar7 = (undefined1 *)(lVar4 + (int)(uVar5 * 3));
        *puVar7 = (char)(codePoints_local._4_4_ >> 0x10);
        puVar7[1] = (char)(codePoints_local._4_4_ >> 8);
        puVar7[2] = (char)codePoints_local._4_4_;
      }
      else if (cVar1 == '\x03') {
        *(uint32_t *)(lVar4 + (long)(int)uVar5 * 4) = codePoints_local._4_4_;
      }
      else {
        if (cVar1 == '\t') goto LAB_00393c2a;
        *(short *)(lVar4 + (long)(int)uVar5 * 2) = (short)codePoints_local._4_4_;
      }
      *puVar6 = *puVar6 | (uint)(1L << ((byte)uVar2 & 0xf) + 0x10);
    }
    codePoints_local._4_4_ = codePoints_local._4_4_ + 1;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static UBool U_CALLCONV
writeStage3Roundtrip(const void *context, uint32_t value, UChar32 codePoints[32]) {
    UConverterMBCSTable *mbcsTable=(UConverterMBCSTable *)context;
    const uint16_t *table;
    uint32_t *stage2;
    uint8_t *bytes, *p;
    UChar32 c;
    int32_t i, st3;

    table=mbcsTable->fromUnicodeTable;
    bytes=(uint8_t *)mbcsTable->fromUnicodeBytes;

    /* for EUC outputTypes, modify the value like genmbcs.c's transformEUC() */
    switch(mbcsTable->outputType) {
    case MBCS_OUTPUT_3_EUC:
        if(value<=0xffff) {
            /* short sequences are stored directly */
            /* code set 0 or 1 */
        } else if(value<=0x8effff) {
            /* code set 2 */
            value&=0x7fff;
        } else /* first byte is 0x8f */ {
            /* code set 3 */
            value&=0xff7f;
        }
        break;
    case MBCS_OUTPUT_4_EUC:
        if(value<=0xffffff) {
            /* short sequences are stored directly */
            /* code set 0 or 1 */
        } else if(value<=0x8effffff) {
            /* code set 2 */
            value&=0x7fffff;
        } else /* first byte is 0x8f */ {
            /* code set 3 */
            value&=0xff7fff;
        }
        break;
    default:
        break;
    }

    for(i=0; i<=0x1f; ++value, ++i) {
        c=codePoints[i];
        if(c<0) {
            continue;
        }

        /* locate the stage 2 & 3 data */
        stage2=((uint32_t *)table)+table[c>>10]+((c>>4)&0x3f);
        p=bytes;
        st3=(int32_t)(uint16_t)*stage2*16+(c&0xf);

        /* write the codepage bytes into stage 3 */
        switch(mbcsTable->outputType) {
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4_EUC:
            p+=st3*3;
            p[0]=(uint8_t)(value>>16);
            p[1]=(uint8_t)(value>>8);
            p[2]=(uint8_t)value;
            break;
        case MBCS_OUTPUT_4:
            ((uint32_t *)p)[st3]=value;
            break;
        default:
            /* 2 bytes per character */
            ((uint16_t *)p)[st3]=(uint16_t)value;
            break;
        }

        /* set the roundtrip flag */
        *stage2|=(1UL<<(16+(c&0xf)));
    }
    return TRUE;
 }